

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O3

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::handle_cli_req_callback_async
          (raft_server *this,ptr<cmd_result<ptr<buffer>_>_> *async_res)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  ptr<cmd_result<ptr<buffer>_>_> pVar3;
  
  pp_Var1 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
  *(undefined1 *)((long)pp_Var1 + 0x35) = 1;
  this->_vptr_raft_server = pp_Var1;
  peVar2 = *(element_type **)&(in_RDX._M_pi)->_M_use_count;
  (in_RDX._M_pi)->_M_use_count = 0;
  (in_RDX._M_pi)->_M_weak_count = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (in_RDX._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  pVar3.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = in_RDX._M_pi;
  pVar3.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar3.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > >
    raft_server::handle_cli_req_callback_async(ptr< cmd_result< ptr<buffer> > > async_res)
{
    async_res->accept();
    return async_res;
}